

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O2

int av1_selfguided_restoration_sse4_1
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  void *__s;
  void *__s_00;
  int *piVar1;
  int32_t *piVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int32_t iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int j_4;
  void *__s_01;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 (*pauVar22) [16];
  int j_2;
  ulong uVar23;
  int32_t *piVar24;
  int32_t *piVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  int r;
  uint8_t *puVar31;
  long lVar32;
  int j_3;
  int iVar33;
  int iVar34;
  int r_1;
  uint uVar35;
  int extraout_XMM0_Da;
  int extraout_XMM0_Da_00;
  undefined8 extraout_XMM0_Qa;
  uint uVar38;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  int extraout_XMM0_Db_00;
  uint uVar39;
  int extraout_XMM0_Dc_00;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  int extraout_XMM0_Db;
  int extraout_XMM0_Dc;
  uint uVar40;
  undefined8 extraout_XMM0_Qb_00;
  int extraout_XMM0_Dd;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined8 extraout_XMM0_Qb_02;
  int extraout_XMM0_Dd_00;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar53;
  int iVar54;
  undefined1 in_XMM4 [16];
  undefined1 auVar55 [16];
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  __m128i alVar61;
  __m128i sum2;
  __m128i sum1;
  __m128i sum1_00;
  undefined1 local_148 [16];
  int32_t *local_130;
  int32_t *local_88;
  undefined1 local_78 [72];
  
  uVar14 = (ulong)(uint)width;
  __s_01 = aom_memalign(0x10,0x1fa40);
  if (__s_01 == (void *)0x0) {
    iVar30 = -1;
  }
  else {
    uVar23 = 0;
    memset(__s_01,0,0x1fa40);
    uVar16 = height + 6;
    iVar30 = (width + 9U & 0xfffffffc) + 0x10;
    __s = (void *)((long)__s_01 + 0xfd2c);
    __s_00 = (void *)((long)__s_01 + 0x17bbc);
    lVar18 = (long)iVar30;
    puVar31 = dgd8 + (dgd_stride * -3 + -3);
    lVar19 = (long)width;
    if (highbd == 0) {
      sVar3 = lVar19 * 4 + 0x1c;
      memset(__s,0,sVar3);
      memset(__s_00,0,sVar3);
      uVar27 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar27 = uVar23;
      }
      lVar21 = (long)__s_01 + lVar18 * 4 + 0x17bc0;
      lVar32 = (long)__s_01 + 0x17bc0;
      while (uVar23 != uVar27) {
        uVar23 = uVar23 + 1;
        *(undefined4 *)((long)__s_00 + uVar23 * lVar18 * 4) = 0;
        *(undefined4 *)((long)__s + uVar23 * lVar18 * 4) = 0;
        iVar60 = 0;
        auVar55 = (undefined1  [16])0x0;
        for (lVar20 = 0; lVar20 < width + 6; lVar20 = lVar20 + 4) {
          piVar1 = (int *)(lVar32 + lVar20 * 4);
          iVar17 = piVar1[1];
          iVar34 = piVar1[2];
          iVar33 = piVar1[3];
          auVar41 = pmovzxbd(in_XMM4,*(undefined4 *)(puVar31 + lVar20));
          piVar4 = (int *)(lVar32 + -0x7e90 + lVar20 * 4);
          iVar29 = *piVar4;
          iVar6 = piVar4[1];
          iVar7 = piVar4[2];
          iVar8 = piVar4[3];
          iVar53 = auVar41._0_4_;
          iVar56 = iVar53 + auVar41._4_4_;
          in_XMM4 = pmaddwd(auVar41,auVar41);
          iVar54 = in_XMM4._0_4_;
          iVar58 = iVar54 + in_XMM4._4_4_;
          iVar57 = iVar56 + auVar55._12_4_ + iVar33 + auVar41._8_4_ + auVar41._12_4_;
          iVar59 = iVar58 + iVar60 + iVar8 + in_XMM4._8_4_ + in_XMM4._12_4_;
          piVar4 = (int *)(lVar21 + lVar20 * 4);
          *piVar4 = auVar55._0_4_ + *piVar1 + iVar53;
          piVar4[1] = auVar55._4_4_ + iVar17 + iVar56;
          piVar4[2] = iVar53 + auVar55._8_4_ + iVar34 + auVar41._4_4_ + auVar41._8_4_;
          piVar4[3] = iVar57;
          piVar1 = (int *)(lVar21 + -0x7e90 + lVar20 * 4);
          *piVar1 = iVar60 + iVar29 + iVar54;
          piVar1[1] = iVar60 + iVar6 + iVar58;
          piVar1[2] = iVar54 + iVar60 + iVar7 + in_XMM4._4_4_ + in_XMM4._8_4_;
          piVar1[3] = iVar59;
          iVar57 = iVar57 - iVar33;
          auVar55._4_4_ = iVar57;
          auVar55._0_4_ = iVar57;
          auVar55._8_4_ = iVar57;
          auVar55._12_4_ = iVar57;
          iVar60 = iVar59 - iVar8;
        }
        puVar31 = puVar31 + dgd_stride;
        lVar21 = lVar21 + lVar18 * 4;
        lVar32 = lVar32 + lVar18 * 4;
      }
    }
    else {
      lVar32 = (long)puVar31 * 2;
      sVar3 = lVar19 * 4 + 0x1c;
      memset(__s,0,sVar3);
      memset(__s_00,0,sVar3);
      uVar27 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar27 = uVar23;
      }
      lVar20 = (long)__s_01 + lVar18 * 4 + 0x17bc0;
      lVar21 = (long)__s_01 + 0x17bc0;
      while (uVar23 != uVar27) {
        uVar23 = uVar23 + 1;
        *(undefined4 *)((long)__s_00 + uVar23 * lVar18 * 4) = 0;
        *(undefined4 *)((long)__s + uVar23 * lVar18 * 4) = 0;
        iVar60 = 0;
        auVar41 = (undefined1  [16])0x0;
        for (lVar28 = 0; lVar28 < width + 6; lVar28 = lVar28 + 4) {
          piVar1 = (int *)(lVar21 + lVar28 * 4);
          iVar17 = piVar1[1];
          iVar34 = piVar1[2];
          iVar33 = piVar1[3];
          auVar55 = pmovzxwd(in_XMM4,*(undefined8 *)(lVar32 + lVar28 * 2));
          piVar4 = (int *)(lVar21 + -0x7e90 + lVar28 * 4);
          iVar29 = *piVar4;
          iVar6 = piVar4[1];
          iVar7 = piVar4[2];
          iVar8 = piVar4[3];
          iVar53 = auVar55._0_4_;
          iVar56 = iVar53 + auVar55._4_4_;
          in_XMM4 = pmaddwd(auVar55,auVar55);
          iVar54 = in_XMM4._0_4_;
          iVar58 = iVar54 + in_XMM4._4_4_;
          iVar57 = iVar56 + auVar41._12_4_ + iVar33 + auVar55._8_4_ + auVar55._12_4_;
          iVar59 = iVar58 + iVar60 + iVar8 + in_XMM4._8_4_ + in_XMM4._12_4_;
          piVar4 = (int *)(lVar20 + lVar28 * 4);
          *piVar4 = auVar41._0_4_ + *piVar1 + iVar53;
          piVar4[1] = auVar41._4_4_ + iVar17 + iVar56;
          piVar4[2] = iVar53 + auVar41._8_4_ + iVar34 + auVar55._4_4_ + auVar55._8_4_;
          piVar4[3] = iVar57;
          piVar1 = (int *)(lVar20 + -0x7e90 + lVar28 * 4);
          *piVar1 = iVar60 + iVar29 + iVar54;
          piVar1[1] = iVar60 + iVar6 + iVar58;
          piVar1[2] = iVar54 + iVar60 + iVar7 + in_XMM4._4_4_ + in_XMM4._8_4_;
          piVar1[3] = iVar59;
          iVar57 = iVar57 - iVar33;
          auVar41._4_4_ = iVar57;
          auVar41._0_4_ = iVar57;
          auVar41._8_4_ = iVar57;
          auVar41._12_4_ = iVar57;
          iVar60 = iVar59 - iVar8;
        }
        lVar32 = lVar32 + (long)dgd_stride * 2;
        lVar20 = lVar20 + lVar18 * 4;
        lVar21 = lVar21 + lVar18 * 4;
      }
    }
    lVar32 = (long)sgr_params_idx;
    iVar60 = av1_sgr_params[lVar32].r[0];
    lVar21 = (long)(iVar30 * 3);
    bVar15 = (byte)highbd;
    if (0 < iVar60) {
      iVar17 = iVar60 * 2 + 1;
      iVar17 = iVar17 * iVar17;
      iVar34 = av1_sgr_params[lVar32].s[0];
      uVar16 = av1_one_by_x[iVar17 - 1];
      uVar27 = (ulong)uVar16;
      pauVar22 = (undefined1 (*) [16])local_78;
      for (uVar23 = 0x20; uVar23 != 0; uVar23 = uVar23 - 8) {
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff >> (uVar23 & 0xffffffff);
        auVar43._8_8_ = auVar42._8_8_ >> (uVar23 & 0xffffffff);
        auVar55 = pmovsxbd(ZEXT416((uint)uVar23),auVar43);
        *pauVar22 = auVar55;
        pauVar22 = pauVar22 + 1;
      }
      piVar24 = (int32_t *)((long)__s_01 + lVar21 * 4 + 0xfd38);
      for (lVar20 = -1; lVar20 <= height; lVar20 = lVar20 + 2) {
        piVar25 = piVar24;
        iVar33 = width + 2;
        for (lVar28 = -1; lVar28 <= lVar19; lVar28 = lVar28 + 4) {
          lVar26 = lVar19;
          boxsum_from_ii(piVar25 + 0x1fa4,iVar30,iVar60);
          iVar29 = (int)lVar26;
          local_148._8_8_ = extraout_XMM0_Qb;
          local_148._0_8_ = extraout_XMM0_Qa;
          alVar61 = boxsum_from_ii(piVar25,iVar30,iVar60);
          alVar61[0] = alVar61[1];
          auVar55 = extraout_XMM0;
          if (iVar33 < 4) {
            local_148 = local_148 & *(undefined1 (*) [16])(local_78 + (long)iVar33 * 0x10);
            auVar55 = extraout_XMM0 & *(undefined1 (*) [16])(local_78 + (long)iVar33 * 0x10);
          }
          sum1[0] = (ulong)(uint)bit_depth;
          alVar61[1] = uVar27;
          sum1[1]._0_4_ = iVar17;
          sum1[1]._4_4_ = 0;
          compute_p(sum1,alVar61,(int)uVar14,iVar29);
          auVar11._4_4_ = iVar34;
          auVar11._0_4_ = iVar34;
          auVar11._8_4_ = iVar34;
          auVar11._12_4_ = iVar34;
          auVar41 = pmulld(extraout_XMM0_00,auVar11);
          uVar35 = auVar41._0_4_ + 0x80000U >> 0x14;
          uVar38 = auVar41._4_4_ + 0x80000U >> 0x14;
          uVar39 = auVar41._8_4_ + 0x80000U >> 0x14;
          uVar40 = auVar41._12_4_ + 0x80000U >> 0x14;
          uVar27 = (ulong)((uint)(0xff < uVar39) * 0xff | (0xff >= uVar39) * uVar39);
          iVar29 = av1_x_by_xplus1[(uint)(0xff < uVar35) * 0xff | (0xff >= uVar35) * uVar35];
          iVar6 = av1_x_by_xplus1[(uint)(0xff < uVar38) * 0xff | (0xff >= uVar38) * uVar38];
          iVar7 = av1_x_by_xplus1[uVar27];
          iVar8 = av1_x_by_xplus1[(uint)(0xff < uVar40) * 0xff | (0xff >= uVar40) * uVar40];
          *(ulong *)(piVar25 + -0x3f48) = CONCAT44(iVar6,iVar29);
          *(ulong *)(piVar25 + -0x3f46) = CONCAT44(iVar8,iVar7);
          auVar55 = pmovsxwd(auVar55,0x100010001000100);
          auVar44._0_4_ = auVar55._0_4_ - iVar29;
          auVar44._4_4_ = auVar55._4_4_ - iVar6;
          auVar44._8_4_ = auVar55._8_4_ - iVar7;
          auVar44._12_4_ = auVar55._12_4_ - iVar8;
          auVar10._4_4_ = uVar16;
          auVar10._0_4_ = uVar16;
          auVar10._8_4_ = uVar16;
          auVar10._12_4_ = uVar16;
          auVar55 = pmaddwd(auVar44,auVar10);
          auVar55 = pmulld(auVar55,local_148);
          auVar45._0_4_ = auVar55._0_4_ + 0x800U >> 0xc;
          auVar45._4_4_ = auVar55._4_4_ + 0x800U >> 0xc;
          auVar45._8_4_ = auVar55._8_4_ + 0x800U >> 0xc;
          auVar45._12_4_ = auVar55._12_4_ + 0x800U >> 0xc;
          *(undefined1 (*) [16])(piVar25 + -0x1fa4) = auVar45;
          piVar25 = piVar25 + 4;
          iVar33 = iVar33 + -4;
        }
        piVar24 = piVar24 + lVar18 * 2;
      }
      puVar31 = (uint8_t *)((long)dgd8 * 2);
      if (highbd == 0) {
        puVar31 = dgd8;
      }
      lVar20 = 0;
      uVar14 = 0;
      if (0 < height) {
        uVar14 = (ulong)(uint)height;
      }
      lVar28 = lVar18 * 4 + lVar21 * 4;
      lVar26 = (long)__s_01 + lVar28 + 0x7eb0;
      piVar24 = (int32_t *)((long)__s_01 + lVar28 + 0x7eac);
      local_130 = flt0;
      for (uVar23 = 0; uVar23 != uVar14; uVar23 = uVar23 + 1) {
        if ((uVar23 & 1) == 0) {
          piVar25 = piVar24;
          for (lVar28 = 0; lVar28 < lVar19; lVar28 = lVar28 + 4) {
            cross_sum_fast_even_row(piVar25 + -0x1fa4,iVar30);
            local_148._8_8_ = extraout_XMM0_Qb_00;
            local_148._0_8_ = extraout_XMM0_Qa_00;
            cross_sum_fast_even_row(piVar25,iVar30);
            auVar46._8_8_ = 0;
            auVar46._0_8_ = *(ulong *)(puVar31 + ((int)lVar28 + (int)lVar20 << (bVar15 & 0x1f)));
            if (highbd == 0) {
              auVar55 = pmovzxbd(auVar46,auVar46);
            }
            else {
              auVar55 = pmovzxwd(auVar46,auVar46);
            }
            auVar55 = pmaddwd(local_148,auVar55);
            piVar2 = local_130 + lVar28;
            *piVar2 = extraout_XMM0_Da + auVar55._0_4_ + 0x100 >> 9;
            piVar2[1] = extraout_XMM0_Db + auVar55._4_4_ + 0x100 >> 9;
            piVar2[2] = extraout_XMM0_Dc + auVar55._8_4_ + 0x100 >> 9;
            piVar2[3] = extraout_XMM0_Dd + auVar55._12_4_ + 0x100 >> 9;
            piVar25 = piVar25 + 4;
          }
        }
        else {
          for (lVar28 = 0; lVar28 < lVar19; lVar28 = lVar28 + 4) {
            auVar36._8_8_ = 0;
            auVar36._0_8_ = *(ulong *)(puVar31 + ((int)lVar28 + (int)lVar20 << (bVar15 & 0x1f)));
            if (highbd == 0) {
              auVar55 = pmovzxbd(auVar36,auVar36);
            }
            else {
              auVar55 = pmovzxwd(auVar36,auVar36);
            }
            piVar1 = (int *)(lVar26 + -0x7e98 + lVar28 * 4);
            piVar4 = (int *)(lVar26 + -0x7e94 + lVar28 * 4);
            piVar5 = (int *)(lVar26 + -0x7e90 + lVar28 * 4);
            auVar47._0_4_ = *piVar1 + *piVar4 + *piVar5;
            auVar47._4_4_ = piVar1[1] + piVar4[1] + piVar5[1];
            auVar47._8_4_ = piVar1[2] + piVar4[2] + piVar5[2];
            auVar47._12_4_ = piVar1[3] + piVar4[3] + piVar5[3];
            in_XMM4 = pmovsxbd(in_XMM4,0x5050505);
            auVar41 = pmulld(auVar47,in_XMM4);
            auVar48._0_4_ = auVar41._0_4_ + *piVar4;
            auVar48._4_4_ = auVar41._4_4_ + piVar4[1];
            auVar48._8_4_ = auVar41._8_4_ + piVar4[2];
            auVar48._12_4_ = auVar41._12_4_ + piVar4[3];
            auVar41 = pmaddwd(auVar48,auVar55);
            piVar1 = (int *)(lVar26 + -8 + lVar28 * 4);
            piVar4 = (int *)(lVar26 + -4 + lVar28 * 4);
            iVar60 = piVar4[1];
            iVar17 = piVar4[2];
            iVar34 = piVar4[3];
            piVar5 = (int *)(lVar26 + lVar28 * 4);
            auVar37._0_4_ = *piVar1 + *piVar4 + *piVar5;
            auVar37._4_4_ = piVar1[1] + iVar60 + piVar5[1];
            auVar37._8_4_ = piVar1[2] + iVar17 + piVar5[2];
            auVar37._12_4_ = piVar1[3] + iVar34 + piVar5[3];
            auVar55 = pmulld(auVar37,in_XMM4);
            piVar25 = local_130 + lVar28;
            *piVar25 = auVar55._0_4_ + *piVar4 + auVar41._0_4_ + 0x80 >> 8;
            piVar25[1] = auVar55._4_4_ + iVar60 + auVar41._4_4_ + 0x80 >> 8;
            piVar25[2] = auVar55._8_4_ + iVar17 + auVar41._8_4_ + 0x80 >> 8;
            piVar25[3] = auVar55._12_4_ + iVar34 + auVar41._12_4_ + 0x80 >> 8;
          }
        }
        local_130 = local_130 + flt_stride;
        lVar20 = lVar20 + (ulong)(uint)dgd_stride;
        lVar26 = lVar26 + lVar18 * 4;
        piVar24 = piVar24 + lVar18;
      }
    }
    iVar60 = av1_sgr_params[lVar32].r[1];
    if (0 < iVar60) {
      iVar17 = iVar60 * 2 + 1;
      iVar17 = iVar17 * iVar17;
      uVar16 = av1_sgr_params[lVar32].s[1];
      uVar23 = (ulong)uVar16;
      iVar9 = av1_one_by_x[iVar17 - 1];
      pauVar22 = (undefined1 (*) [16])local_78;
      for (uVar14 = 0x20; uVar14 != 0; uVar14 = uVar14 - 8) {
        auVar49._8_4_ = 0xffffffff;
        auVar49._0_8_ = 0xffffffffffffffff;
        auVar49._12_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff >> (uVar14 & 0xffffffff);
        auVar50._8_8_ = auVar49._8_8_ >> (uVar14 & 0xffffffff);
        auVar55 = pmovsxbd(ZEXT416((uint)uVar14),auVar50);
        *pauVar22 = auVar55;
        pauVar22 = pauVar22 + 1;
      }
      piVar24 = (int32_t *)((long)__s_01 + lVar21 * 4 + 0xfd38);
      for (lVar32 = -1; lVar32 <= height; lVar32 = lVar32 + 1) {
        lVar28 = lVar18 * 4;
        piVar25 = piVar24;
        iVar34 = width + 2;
        for (lVar20 = -1; lVar20 <= lVar19; lVar20 = lVar20 + 4) {
          lVar26 = lVar19;
          boxsum_from_ii(piVar25 + 0x1fa4,iVar30,iVar60);
          iVar33 = (int)lVar26;
          local_148._8_8_ = extraout_XMM0_Qb_01;
          local_148._0_8_ = extraout_XMM0_Qa_01;
          alVar61 = boxsum_from_ii(piVar25,iVar30,iVar60);
          sum2[0] = alVar61[1];
          auVar55 = extraout_XMM0_01;
          if (iVar34 < 4) {
            local_148 = local_148 & *(undefined1 (*) [16])(local_78 + (long)iVar34 * 0x10);
            auVar55 = extraout_XMM0_01 & *(undefined1 (*) [16])(local_78 + (long)iVar34 * 0x10);
          }
          sum1_00[0] = (ulong)(uint)bit_depth;
          sum2[1] = uVar23;
          sum1_00[1]._0_4_ = iVar17;
          sum1_00[1]._4_4_ = 0;
          compute_p(sum1_00,sum2,(int)lVar28,iVar33);
          auVar13._4_4_ = uVar16;
          auVar13._0_4_ = uVar16;
          auVar13._8_4_ = uVar16;
          auVar13._12_4_ = uVar16;
          auVar41 = pmulld(extraout_XMM0_02,auVar13);
          uVar35 = auVar41._0_4_ + 0x80000U >> 0x14;
          uVar38 = auVar41._4_4_ + 0x80000U >> 0x14;
          uVar39 = auVar41._8_4_ + 0x80000U >> 0x14;
          uVar40 = auVar41._12_4_ + 0x80000U >> 0x14;
          uVar23 = (ulong)((uint)(0xff < uVar39) * 0xff | (0xff >= uVar39) * uVar39);
          iVar33 = av1_x_by_xplus1[(uint)(0xff < uVar35) * 0xff | (0xff >= uVar35) * uVar35];
          iVar29 = av1_x_by_xplus1[(uint)(0xff < uVar38) * 0xff | (0xff >= uVar38) * uVar38];
          iVar6 = av1_x_by_xplus1[uVar23];
          iVar7 = av1_x_by_xplus1[(uint)(0xff < uVar40) * 0xff | (0xff >= uVar40) * uVar40];
          *(ulong *)(piVar25 + -0x3f48) = CONCAT44(iVar29,iVar33);
          *(ulong *)(piVar25 + -0x3f46) = CONCAT44(iVar7,iVar6);
          auVar55 = pmovsxwd(auVar55,0x100010001000100);
          auVar51._0_4_ = auVar55._0_4_ - iVar33;
          auVar51._4_4_ = auVar55._4_4_ - iVar29;
          auVar51._8_4_ = auVar55._8_4_ - iVar6;
          auVar51._12_4_ = auVar55._12_4_ - iVar7;
          auVar12._4_4_ = iVar9;
          auVar12._0_4_ = iVar9;
          auVar12._8_4_ = iVar9;
          auVar12._12_4_ = iVar9;
          auVar55 = pmaddwd(auVar51,auVar12);
          auVar55 = pmulld(auVar55,local_148);
          piVar25[-0x1fa4] = auVar55._0_4_ + 0x800U >> 0xc;
          piVar25[-0x1fa3] = auVar55._4_4_ + 0x800U >> 0xc;
          piVar25[-0x1fa2] = auVar55._8_4_ + 0x800U >> 0xc;
          piVar25[-0x1fa1] = auVar55._12_4_ + 0x800U >> 0xc;
          piVar25 = piVar25 + 4;
          iVar34 = iVar34 + -4;
        }
        piVar24 = piVar24 + lVar18;
      }
      puVar31 = (uint8_t *)((long)dgd8 * 2);
      if (highbd == 0) {
        puVar31 = dgd8;
      }
      uVar23 = 0;
      uVar14 = (ulong)(uint)height;
      if (height < 1) {
        uVar14 = uVar23;
      }
      piVar24 = (int32_t *)((long)__s_01 + lVar18 * 4 + lVar21 * 4 + 0x7eac);
      local_88 = flt1;
      for (uVar27 = 0; uVar27 != uVar14; uVar27 = uVar27 + 1) {
        piVar25 = piVar24;
        for (lVar32 = 0; lVar32 < lVar19; lVar32 = lVar32 + 4) {
          cross_sum(piVar25 + -0x1fa4,iVar30);
          local_148._8_8_ = extraout_XMM0_Qb_02;
          local_148._0_8_ = extraout_XMM0_Qa_02;
          cross_sum(piVar25,iVar30);
          auVar52._8_8_ = 0;
          auVar52._0_8_ = *(ulong *)(puVar31 + ((int)uVar23 + (int)lVar32 << (bVar15 & 0x1f)));
          if (highbd == 0) {
            auVar55 = pmovzxbd(auVar52,auVar52);
          }
          else {
            auVar55 = pmovzxwd(auVar52,auVar52);
          }
          auVar55 = pmaddwd(local_148,auVar55);
          piVar2 = local_88 + lVar32;
          *piVar2 = extraout_XMM0_Da_00 + auVar55._0_4_ + 0x100 >> 9;
          piVar2[1] = extraout_XMM0_Db_00 + auVar55._4_4_ + 0x100 >> 9;
          piVar2[2] = extraout_XMM0_Dc_00 + auVar55._8_4_ + 0x100 >> 9;
          piVar2[3] = extraout_XMM0_Dd_00 + auVar55._12_4_ + 0x100 >> 9;
          piVar25 = piVar25 + 4;
        }
        local_88 = local_88 + flt_stride;
        uVar23 = uVar23 + (uint)dgd_stride;
        piVar24 = piVar24 + lVar18;
      }
    }
    aom_free(__s_01);
    iVar30 = 0;
  }
  return iVar30;
}

Assistant:

int av1_selfguided_restoration_sse4_1(const uint8_t *dgd8, int width,
                                      int height, int dgd_stride, int32_t *flt0,
                                      int32_t *flt1, int flt_stride,
                                      int sgr_params_idx, int bit_depth,
                                      int highbd) {
  int32_t *buf = (int32_t *)aom_memalign(
      16, 4 * sizeof(*buf) * RESTORATION_PROC_UNIT_PELS);
  if (!buf) return -1;
  memset(buf, 0, 4 * sizeof(*buf) * RESTORATION_PROC_UNIT_PELS);

  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;

  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 16 bytes for efficiency.
  int buf_stride = ((width_ext + 3) & ~3) + 16;

  // The "tl" pointers point at the top-left of the initialised data for the
  // array. Adding 3 here ensures that column 1 is 16-byte aligned.
  int32_t *Atl = buf + 0 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Btl = buf + 1 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Ctl = buf + 2 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Dtl = buf + 3 * RESTORATION_PROC_UNIT_PELS + 3;

  // The "0" pointers are (- SGRPROJ_BORDER_VERT, -SGRPROJ_BORDER_HORZ). Note
  // there's a zero row and column in A, B (integral images), so we move down
  // and right one for them.
  const int buf_diag_border =
      SGRPROJ_BORDER_HORZ + buf_stride * SGRPROJ_BORDER_VERT;

  int32_t *A0 = Atl + 1 + buf_stride;
  int32_t *B0 = Btl + 1 + buf_stride;
  int32_t *C0 = Ctl + 1 + buf_stride;
  int32_t *D0 = Dtl + 1 + buf_stride;

  // Finally, A, B, C, D point at position (0, 0).
  int32_t *A = A0 + buf_diag_border;
  int32_t *B = B0 + buf_diag_border;
  int32_t *C = C0 + buf_diag_border;
  int32_t *D = D0 + buf_diag_border;

  const int dgd_diag_border =
      SGRPROJ_BORDER_HORZ + dgd_stride * SGRPROJ_BORDER_VERT;
  const uint8_t *dgd0 = dgd8 - dgd_diag_border;

  // Generate integral images from the input. C will contain sums of squares; D
  // will contain just sums
  if (highbd)
    integral_images_highbd(CONVERT_TO_SHORTPTR(dgd0), dgd_stride, width_ext,
                           height_ext, Ctl, Dtl, buf_stride);
  else
    integral_images(dgd0, dgd_stride, width_ext, height_ext, Ctl, Dtl,
                    buf_stride);

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // Write to flt0 and flt1
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));
  assert(params->r[0] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));
  assert(params->r[1] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));

  if (params->r[0] > 0) {
    calc_ab_fast(A, B, C, D, width, height, buf_stride, bit_depth,
                 sgr_params_idx, 0);
    final_filter_fast(flt0, flt_stride, A, B, buf_stride, dgd8, dgd_stride,
                      width, height, highbd);
  }

  if (params->r[1] > 0) {
    calc_ab(A, B, C, D, width, height, buf_stride, bit_depth, sgr_params_idx,
            1);
    final_filter(flt1, flt_stride, A, B, buf_stride, dgd8, dgd_stride, width,
                 height, highbd);
  }
  aom_free(buf);
  return 0;
}